

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::IncreaseBlockReferenceCountInternal
          (SingleFileBlockManager *this,block_id_t block_id)

{
  iterator iVar1;
  mapped_type *pmVar2;
  block_id_t local_10;
  
  local_10 = block_id;
  iVar1 = ::std::
          _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->multi_use_blocks)._M_h,&local_10);
  if (iVar1.super__Node_iterator_base<std::pair<const_long,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    pmVar2 = ::std::__detail::
             _Map_base<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->multi_use_blocks,&local_10);
    *pmVar2 = 2;
  }
  else {
    *(int *)((long)iVar1.super__Node_iterator_base<std::pair<const_long,_unsigned_int>,_false>.
                   _M_cur + 0x10) =
         *(int *)((long)iVar1.super__Node_iterator_base<std::pair<const_long,_unsigned_int>,_false>.
                        _M_cur + 0x10) + 1;
  }
  return;
}

Assistant:

void SingleFileBlockManager::IncreaseBlockReferenceCountInternal(block_id_t block_id) {
	D_ASSERT(block_id >= 0);
	D_ASSERT(block_id < max_block);
	D_ASSERT(free_list.find(block_id) == free_list.end());
	auto entry = multi_use_blocks.find(block_id);
	if (entry != multi_use_blocks.end()) {
		entry->second++;
	} else {
		multi_use_blocks[block_id] = 2;
	}
}